

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O2

bool __thiscall ProtocolARP::IsLocal(ProtocolARP *this,uint8_t *protocolAddress)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  uint8_t *puVar6;
  ulong uVar7;
  
  uVar4 = 0;
  do {
    uVar7 = (ulong)uVar4;
    sVar5 = ProtocolIPv4::AddressSize(this->IP);
    if (sVar5 <= uVar7) break;
    bVar1 = protocolAddress[uVar7];
    puVar6 = ProtocolIPv4::GetSubnetMask(this->IP);
    bVar2 = puVar6[uVar7];
    puVar6 = ProtocolIPv4::GetUnicastAddress(this->IP);
    bVar3 = puVar6[uVar7];
    puVar6 = ProtocolIPv4::GetSubnetMask(this->IP);
    uVar4 = uVar4 + 1;
  } while ((bVar1 & bVar2) == (bVar3 & puVar6[uVar7]));
  sVar5 = ProtocolIPv4::AddressSize(this->IP);
  return sVar5 == uVar7;
}

Assistant:

bool ProtocolARP::IsLocal(const uint8_t* protocolAddress)
{
    uint32_t i;

    for (i = 0; i < IP.AddressSize(); i++)
    {
        if ((protocolAddress[i] & IP.GetSubnetMask()[i]) !=
            (IP.GetUnicastAddress()[i] & IP.GetSubnetMask()[i]))
        {
            break;
        }
    }

    return i == IP.AddressSize();
}